

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsets.hpp
# Opt level: O1

iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsets<std::initializer_list<int>&,std::greater<void>>
          (iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,burst *this)

{
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  *End;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  begin;
  int *local_d8;
  int *piStack_d0;
  pointer local_c8;
  pointer ppiStack_c0;
  pointer local_b8;
  difference_type dStack_b0;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_98;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_60;
  
  End = *(subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          **)(this + 8);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::subset_iterator(&local_60,*(long *)this,*(long *)this + (long)End * 4);
  local_d8 = local_60.m_begin;
  piStack_d0 = local_60.m_end;
  local_c8 = local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppiStack_c0 = local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_b8 = local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  dStack_b0 = local_60.m_subset_size;
  local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.m_begin = local_60.m_begin;
  local_98.m_end = local_60.m_end;
  local_98.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.m_subset_size = 0;
  boost::
  make_iterator_range<burst::subset_iterator<int_const*,std::greater<void>,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_d8,&local_98,End);
  if (local_98.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto subsets (ForwardRange && range, Compare compare)
    {
        auto begin = make_subset_iterator(std::forward<ForwardRange>(range), compare);
        auto end = make_subset_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }